

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt_wallet_tests.cpp
# Opt level: O0

void __thiscall wallet::psbt_wallet_tests::psbt_updater_test::test_method(psbt_updater_test *this)

{
  Span<const_std::byte> sp;
  Span<const_std::byte> sp_00;
  Span<const_std::byte> sp_01;
  Span<const_std::byte> s;
  bool bVar1;
  __atomic_base<long> n_signed;
  long lVar2;
  bool *complete_00;
  PartiallySignedTransaction *psbtx_00;
  _Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true> _Var3;
  SignatureData *this_00;
  reference pvVar4;
  long in_RDI;
  long in_FS_OFFSET;
  ParamsWrapper<TransactionSerParams,_std::shared_ptr<const_CTransaction>_> PVar5;
  pair<std::__detail::_Node_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>,_bool>
  pVar6;
  DataStream ssTx;
  bool complete;
  DataStream ssData;
  CTransactionRef prev_tx2;
  DataStream s_prev_tx2;
  CTransactionRef prev_tx1;
  DataStream s_prev_tx1;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock5;
  SignatureData sigdata;
  string final_hex;
  PartiallySignedTransaction psbtx;
  char *in_stack_fffffffffffff458;
  basic_cstring<const_char> *pbVar7;
  char *in_stack_fffffffffffff460;
  undefined4 uVar8;
  char *in_stack_fffffffffffff468;
  DataStream *in_stack_fffffffffffff470;
  undefined4 in_stack_fffffffffffff478;
  int in_stack_fffffffffffff47c;
  lazy_ostream *in_stack_fffffffffffff480;
  _Optional_payload_base<common::PSBTError> in_stack_fffffffffffff488;
  const_string *in_stack_fffffffffffff490;
  const_string *file;
  undefined7 in_stack_fffffffffffff498;
  undefined1 in_stack_fffffffffffff49f;
  CWallet *in_stack_fffffffffffff4a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff4a8;
  CWallet *this_01;
  const_string local_a50 [2];
  lazy_ostream local_a30 [2];
  undefined1 local_9d8 [16];
  undefined1 local_9c8 [80];
  undefined8 local_978;
  undefined8 uStack_970;
  undefined8 local_968;
  undefined8 uStack_960;
  const_string local_950 [2];
  lazy_ostream local_930 [2];
  assertion_result local_910 [2];
  undefined1 local_8d1;
  allocator<char> local_89c;
  allocator<char> local_89b;
  allocator<char> local_89a [26];
  ParamsWrapper<TransactionSerParams,_std::shared_ptr<const_CTransaction>_> local_880;
  undefined1 local_3f0 [1000];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffff458);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
             CONCAT17(in_stack_fffffffffffff49f,in_stack_fffffffffffff498),
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffff490,
             (char *)in_stack_fffffffffffff488,(char *)in_stack_fffffffffffff480,
             in_stack_fffffffffffff47c,SUB41((uint)in_stack_fffffffffffff478 >> 0x18,0));
  CWallet::SetWalletFlag
            (in_stack_fffffffffffff4a0,CONCAT17(in_stack_fffffffffffff49f,in_stack_fffffffffffff498)
            );
  util::hex_literals::
  operator___hex<util::hex_literals::detail::Hex<497UL>___2,_0,_0,_0,_0,_1,_1,_88,_232,_122,_______>
            ();
  Span<std::byte_const>::Span<std::array<std::byte,248ul>>
            ((Span<const_std::byte> *)in_stack_fffffffffffff468,
             (array<std::byte,_248UL> *)in_stack_fffffffffffff460,in_stack_fffffffffffff458);
  sp.m_size._0_4_ = in_stack_fffffffffffff488._M_payload;
  sp.m_size._4_1_ = in_stack_fffffffffffff488._M_engaged;
  sp.m_size._5_3_ = in_stack_fffffffffffff488._5_3_;
  sp.m_data = (byte *)in_stack_fffffffffffff480;
  DataStream::DataStream(in_stack_fffffffffffff470,sp);
  std::shared_ptr<const_CTransaction>::shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_fffffffffffff458);
  PVar5 = TransactionSerParams::operator()
                    ((TransactionSerParams *)in_stack_fffffffffffff468,
                     (shared_ptr<const_CTransaction> *)in_stack_fffffffffffff460);
  n_signed._M_i = (__int_type_conflict3)PVar5.m_params;
  DataStream::operator>>
            ((DataStream *)in_stack_fffffffffffff468,
             (ParamsWrapper<TransactionSerParams,_std::shared_ptr<const_CTransaction>_> *)
             in_stack_fffffffffffff460);
  lVar2 = in_RDI + 0x6d8;
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_fffffffffffff458);
  CTransaction::GetHash((CTransaction *)in_stack_fffffffffffff458);
  std::forward_as_tuple<transaction_identifier<false>const&>
            ((transaction_identifier<false> *)in_stack_fffffffffffff460);
  TxStateInactive::TxStateInactive((TxStateInactive *)in_stack_fffffffffffff458,false);
  std::forward_as_tuple<std::shared_ptr<CTransaction_const>&,wallet::TxStateInactive>
            ((shared_ptr<const_CTransaction> *)in_stack_fffffffffffff460,
             (TxStateInactive *)in_stack_fffffffffffff458);
  std::
  unordered_map<uint256,wallet::CWalletTx,SaltedTxidHasher,std::equal_to<uint256>,std::allocator<std::pair<uint256_const,wallet::CWalletTx>>>
  ::
  emplace<std::piecewise_construct_t_const&,std::tuple<transaction_identifier<false>const&>,std::tuple<std::shared_ptr<CTransaction_const>&,wallet::TxStateInactive&&>>
            ((unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
              *)CONCAT44(in_stack_fffffffffffff47c,in_stack_fffffffffffff478),
             (piecewise_construct_t *)in_stack_fffffffffffff470,
             (tuple<const_transaction_identifier<false>_&> *)in_stack_fffffffffffff468,
             (tuple<std::shared_ptr<const_CTransaction>_&,_wallet::TxStateInactive_&&> *)
             in_stack_fffffffffffff460);
  util::hex_literals::
  operator___hex<util::hex_literals::detail::Hex<375UL>___2,_0,_0,_0,_1,_170,_215,_57,_49,_1,_______>
            ();
  Span<std::byte_const>::Span<std::array<std::byte,187ul>>
            ((Span<const_std::byte> *)in_stack_fffffffffffff468,
             (array<std::byte,_187UL> *)in_stack_fffffffffffff460,in_stack_fffffffffffff458);
  sp_00.m_size._0_4_ = in_stack_fffffffffffff488._M_payload;
  sp_00.m_size._4_1_ = in_stack_fffffffffffff488._M_engaged;
  sp_00.m_size._5_3_ = in_stack_fffffffffffff488._5_3_;
  sp_00.m_data = (byte *)in_stack_fffffffffffff480;
  DataStream::DataStream(in_stack_fffffffffffff470,sp_00);
  this_01 = (CWallet *)&stack0xfffffffffffff790;
  std::shared_ptr<const_CTransaction>::shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_fffffffffffff458);
  local_880 = TransactionSerParams::operator()
                        ((TransactionSerParams *)in_stack_fffffffffffff468,
                         (shared_ptr<const_CTransaction> *)in_stack_fffffffffffff460);
  DataStream::operator>>
            ((DataStream *)in_stack_fffffffffffff468,
             (ParamsWrapper<TransactionSerParams,_std::shared_ptr<const_CTransaction>_> *)
             in_stack_fffffffffffff460);
  complete_00 = (bool *)(in_RDI + 0x6d8);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_fffffffffffff458);
  psbtx_00 = (PartiallySignedTransaction *)
             CTransaction::GetHash((CTransaction *)in_stack_fffffffffffff458);
  std::forward_as_tuple<transaction_identifier<false>const&>
            ((transaction_identifier<false> *)in_stack_fffffffffffff460);
  TxStateInactive::TxStateInactive((TxStateInactive *)in_stack_fffffffffffff458,false);
  std::forward_as_tuple<std::shared_ptr<CTransaction_const>&,wallet::TxStateInactive>
            ((shared_ptr<const_CTransaction> *)in_stack_fffffffffffff460,
             (TxStateInactive *)in_stack_fffffffffffff458);
  pVar6 = std::
          unordered_map<uint256,wallet::CWalletTx,SaltedTxidHasher,std::equal_to<uint256>,std::allocator<std::pair<uint256_const,wallet::CWalletTx>>>
          ::
          emplace<std::piecewise_construct_t_const&,std::tuple<transaction_identifier<false>const&>,std::tuple<std::shared_ptr<CTransaction_const>&,wallet::TxStateInactive&&>>
                    ((unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
                      *)CONCAT44(in_stack_fffffffffffff47c,in_stack_fffffffffffff478),
                     (piecewise_construct_t *)in_stack_fffffffffffff470,
                     (tuple<const_transaction_identifier<false>_&> *)in_stack_fffffffffffff468,
                     (tuple<std::shared_ptr<const_CTransaction>_&,_wallet::TxStateInactive_&&> *)
                     in_stack_fffffffffffff460);
  _Var3._M_cur = (__node_type *)
                 pVar6.first.
                 super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>._M_cur
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff4a8,(char *)in_stack_fffffffffffff4a0,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffff49f,in_stack_fffffffffffff498));
  import_descriptor(in_stack_fffffffffffff4a0,
                    (string *)CONCAT17(in_stack_fffffffffffff49f,in_stack_fffffffffffff498));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff458);
  std::allocator<char>::~allocator(local_89a);
  this_00 = (SignatureData *)(in_RDI + 0x490);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff4a8,(char *)in_stack_fffffffffffff4a0,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffff49f,in_stack_fffffffffffff498));
  import_descriptor(in_stack_fffffffffffff4a0,
                    (string *)CONCAT17(in_stack_fffffffffffff49f,in_stack_fffffffffffff498));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff458);
  std::allocator<char>::~allocator(&local_89b);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff4a8,(char *)in_stack_fffffffffffff4a0,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffff49f,in_stack_fffffffffffff498));
  import_descriptor(in_stack_fffffffffffff4a0,
                    (string *)CONCAT17(in_stack_fffffffffffff49f,in_stack_fffffffffffff498));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff458);
  std::allocator<char>::~allocator(&local_89c);
  PartiallySignedTransaction::PartiallySignedTransaction
            ((PartiallySignedTransaction *)in_stack_fffffffffffff458);
  util::hex_literals::
  operator___hex<util::hex_literals::detail::Hex<335UL>___112,_115,_98,_116,_255,_1,_0,_154,_2,_0,_______>
            ();
  Span<std::byte_const>::Span<std::array<std::byte,167ul>>
            ((Span<const_std::byte> *)in_stack_fffffffffffff468,
             (array<std::byte,_167UL> *)in_stack_fffffffffffff460,in_stack_fffffffffffff458);
  sp_01.m_size._0_4_ = in_stack_fffffffffffff488._M_payload;
  sp_01.m_size._4_1_ = in_stack_fffffffffffff488._M_engaged;
  sp_01.m_size._5_3_ = in_stack_fffffffffffff488._5_3_;
  sp_01.m_data = (byte *)in_stack_fffffffffffff480;
  DataStream::DataStream(in_stack_fffffffffffff470,sp_01);
  DataStream::operator>>
            ((DataStream *)in_stack_fffffffffffff468,
             (PartiallySignedTransaction *)in_stack_fffffffffffff460);
  local_8d1 = 1;
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff468,in_stack_fffffffffffff460,
               (unsigned_long)in_stack_fffffffffffff458);
    uVar8 = (undefined4)((ulong)in_stack_fffffffffffff460 >> 0x20);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff458);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff49f,in_stack_fffffffffffff498),
               in_stack_fffffffffffff490,(size_t)in_stack_fffffffffffff488,
               (const_string *)in_stack_fffffffffffff480);
    in_stack_fffffffffffff460 = (char *)CONCAT44(uVar8,1);
    pbVar7 = (basic_cstring<const_char> *)0x0;
    CWallet::FillPSBT(this_01,psbtx_00,complete_00,(int)((ulong)lVar2 >> 0x20),
                      SUB81((ulong)_Var3._M_cur >> 0x38,0),SUB81((ulong)_Var3._M_cur >> 0x30,0),
                      (size_t *)n_signed._M_i,SUB81((ulong)_Var3._M_cur >> 0x28,0));
    std::optional::operator_cast_to_bool((optional<common::PSBTError> *)pbVar7);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff468,
               SUB81((ulong)in_stack_fffffffffffff460 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff468,in_stack_fffffffffffff460,
               (unsigned_long)pbVar7);
    boost::unit_test::operator<<((lazy_ostream *)in_stack_fffffffffffff460,pbVar7);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff468,in_stack_fffffffffffff460,
               (unsigned_long)pbVar7);
    in_stack_fffffffffffff458 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_910,local_930,local_950,0x43,REQUIRE,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff458);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff458);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  local_968 = 0;
  uStack_960 = 0;
  local_978 = 0;
  uStack_970 = 0;
  DataStream::DataStream((DataStream *)in_stack_fffffffffffff458);
  DataStream::operator<<
            ((DataStream *)in_stack_fffffffffffff468,
             (PartiallySignedTransaction *)in_stack_fffffffffffff460);
  Span<const_std::byte>::Span<DataStream>
            ((Span<const_std::byte> *)in_stack_fffffffffffff468,
             (DataStream *)in_stack_fffffffffffff460,in_stack_fffffffffffff458);
  s.m_size._0_4_ = in_stack_fffffffffffff488._M_payload;
  s.m_size._4_1_ = in_stack_fffffffffffff488._M_engaged;
  s.m_size._5_3_ = in_stack_fffffffffffff488._5_3_;
  s.m_data = (byte *)in_stack_fffffffffffff480;
  HexStr_abi_cxx11_(s);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff468,in_stack_fffffffffffff460,
               (unsigned_long)in_stack_fffffffffffff458);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff458);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff49f,in_stack_fffffffffffff498),
               in_stack_fffffffffffff490,(size_t)in_stack_fffffffffffff488,
               (const_string *)in_stack_fffffffffffff480);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff460,(char (*) [1])in_stack_fffffffffffff458);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff468,in_stack_fffffffffffff460,
               (unsigned_long)in_stack_fffffffffffff458);
    in_stack_fffffffffffff468 =
         "\"70736274ff01009a020000000258e87a21b56daf0c23be8e7070456c336f7cbaa5c8757924f545887bb2abdd750000000000ffffffff838d0427d0ec650a68aa46bb0b098aea4422c071b2ca78352a077959d07cea1d0100000000ffffffff0270aaf00800000000160014d85c2b71d0060b09c9886aeb815e50991dda124d00e1f5050000000016001400aea9a2e5f0f876a588df5546e8742d1d87008f00000000000100bb0200000001aad73931018bd25f84ae400b68848be09db706eac2ac18298babee71ab656f8b0000000048473044022058f6fc7c6a33e1b31548d481c826c015bd30135aad42cd67790dab66d2ad243b02204a1ced2604c6735b6393e5b41691dd78b00f0c5942fb9f751856faa938157dba01feffffff0280f0fa020000000017a9140fb9463421696b82c833af241c78c17ddbde493487d0f20a270100000017a91429ca74f8a08f81999428185c97b5d852e4063f6187650000000104475221029583bf39ae0a609747ad199addd634fa6108559d6c5cd39b4c2183f1ab96e07f2102dab61ff49a14db6a7d02b0cd1fbb78fc4b18312b5b4e54dae4dba2fbfef536d752ae2206029583bf39ae0a609747ad199addd634fa6108559d6c5cd39b4c2183f1ab96e07f10d90c6a4f000000800000008000000080220602dab61ff49a14db6a7d02b0cd1fbb78fc4b18312b5b4e54dae4dba2fbfef536d710d90c6a4f0000008000000080010000800001008a020000000158e87a21b56daf0c23be8e7070456c336f7cbaa5c8757924f545887bb2abdd7501000000171600145f275f436b09a8cc9a2eb2a2f528485c68a56323feffffff02d8231f1b0100000017a914aed962d6654f9a2b36608eb9d64d2b260db4f1118700c2eb0b0000000017a914b7f5faf40e3d40a5a459b1db3535f2b72fa921e8876500000001012000c2eb0b0000000017a914b7f5faf40e3d40a5a459b1db3535f2b72fa921e88701042200208c2353173743b595dfb4a07b72ba8e42e3797da74e87fe7d9d7497e3b2028903010547522103089dc10c7ac6db54f91329af617333db388cead0c231f723379d1b99030b02dc21023add904f3d6dcf59ddb906b0dee23529b7ffb9ed50e5e86151926860221f0e7352ae2206023add904f3d6dcf59ddb906b0dee23529b7ffb9ed50e5e86151926860221f0e7310d90c6a4f000000800000008003000080220603089dc10c7ac6db54f91329af617333db388cead0c231f723379d1b99030b02dc10d90c6a4f00000080000000800200008000220203a9a4c37f5996d3aa25dbac6b570af0650394492942460b354753ed9eeca5877110d90c6a4f000000800000008004000080002202027f6399757d2eff55a136ad02c684b1838b6556e5f1b6b34282a94b6b5005109610d90c6a4f0000008000000..." /* TRUNCATED STRING LITERAL */
    ;
    in_stack_fffffffffffff460 =
         "70736274ff01009a020000000258e87a21b56daf0c23be8e7070456c336f7cbaa5c8757924f545887bb2abdd750000000000ffffffff838d0427d0ec650a68aa46bb0b098aea4422c071b2ca78352a077959d07cea1d0100000000ffffffff0270aaf00800000000160014d85c2b71d0060b09c9886aeb815e50991dda124d00e1f5050000000016001400aea9a2e5f0f876a588df5546e8742d1d87008f00000000000100bb0200000001aad73931018bd25f84ae400b68848be09db706eac2ac18298babee71ab656f8b0000000048473044022058f6fc7c6a33e1b31548d481c826c015bd30135aad42cd67790dab66d2ad243b02204a1ced2604c6735b6393e5b41691dd78b00f0c5942fb9f751856faa938157dba01feffffff0280f0fa020000000017a9140fb9463421696b82c833af241c78c17ddbde493487d0f20a270100000017a91429ca74f8a08f81999428185c97b5d852e4063f6187650000000104475221029583bf39ae0a609747ad199addd634fa6108559d6c5cd39b4c2183f1ab96e07f2102dab61ff49a14db6a7d02b0cd1fbb78fc4b18312b5b4e54dae4dba2fbfef536d752ae2206029583bf39ae0a609747ad199addd634fa6108559d6c5cd39b4c2183f1ab96e07f10d90c6a4f000000800000008000000080220602dab61ff49a14db6a7d02b0cd1fbb78fc4b18312b5b4e54dae4dba2fbfef536d710d90c6a4f0000008000000080010000800001008a020000000158e87a21b56daf0c23be8e7070456c336f7cbaa5c8757924f545887bb2abdd7501000000171600145f275f436b09a8cc9a2eb2a2f528485c68a56323feffffff02d8231f1b0100000017a914aed962d6654f9a2b36608eb9d64d2b260db4f1118700c2eb0b0000000017a914b7f5faf40e3d40a5a459b1db3535f2b72fa921e8876500000001012000c2eb0b0000000017a914b7f5faf40e3d40a5a459b1db3535f2b72fa921e88701042200208c2353173743b595dfb4a07b72ba8e42e3797da74e87fe7d9d7497e3b2028903010547522103089dc10c7ac6db54f91329af617333db388cead0c231f723379d1b99030b02dc21023add904f3d6dcf59ddb906b0dee23529b7ffb9ed50e5e86151926860221f0e7352ae2206023add904f3d6dcf59ddb906b0dee23529b7ffb9ed50e5e86151926860221f0e7310d90c6a4f000000800000008003000080220603089dc10c7ac6db54f91329af617333db388cead0c231f723379d1b99030b02dc10d90c6a4f00000080000000800200008000220203a9a4c37f5996d3aa25dbac6b570af0650394492942460b354753ed9eeca5877110d90c6a4f000000800000008004000080002202027f6399757d2eff55a136ad02c684b1838b6556e5f1b6b34282a94b6b5005109610d90c6a4f00000080000000..." /* TRUNCATED STRING LITERAL */
    ;
    in_stack_fffffffffffff458 = "final_hex";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[2061]>
              (local_9c8,local_9d8,0x49,1,2,local_3f0);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff458);
    in_stack_fffffffffffff49f = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffff49f);
  std::optional<CMutableTransaction>::operator->
            ((optional<CMutableTransaction> *)in_stack_fffffffffffff458);
  pvVar4 = std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                     ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_fffffffffffff468,
                      (size_type)in_stack_fffffffffffff460);
  (pvVar4->prevout).n = 2;
  SignatureData::SignatureData(this_00);
  do {
    file = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff468,in_stack_fffffffffffff460,
               (unsigned_long)in_stack_fffffffffffff458);
    uVar8 = (undefined4)((ulong)in_stack_fffffffffffff460 >> 0x20);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff458);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff49f,in_stack_fffffffffffff498),file
               ,(size_t)in_stack_fffffffffffff488,(const_string *)in_stack_fffffffffffff480);
    in_stack_fffffffffffff460 = (char *)CONCAT44(uVar8,1);
    pbVar7 = (basic_cstring<const_char> *)0x0;
    in_stack_fffffffffffff488 =
         (_Optional_payload_base<common::PSBTError>)
         CWallet::FillPSBT(this_01,psbtx_00,complete_00,(int)((ulong)lVar2 >> 0x20),
                           SUB81((ulong)_Var3._M_cur >> 0x38,0),SUB81((ulong)_Var3._M_cur >> 0x30,0)
                           ,(size_t *)n_signed._M_i,SUB81((ulong)_Var3._M_cur >> 0x28,0));
    boost::test_tools::assertion_result::assertion_result<std::optional<common::PSBTError>>
              ((assertion_result *)in_stack_fffffffffffff468,
               (optional<common::PSBTError> *)in_stack_fffffffffffff460);
    in_stack_fffffffffffff480 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff468,in_stack_fffffffffffff460,
               (unsigned_long)pbVar7);
    boost::unit_test::operator<<((lazy_ostream *)in_stack_fffffffffffff460,pbVar7);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff468,in_stack_fffffffffffff460,
               (unsigned_long)pbVar7);
    in_stack_fffffffffffff458 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&stack0xfffffffffffff5f0,local_a30,local_a50,0x50,CHECK,
               CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff458);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff458);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  SignatureData::~SignatureData((SignatureData *)in_stack_fffffffffffff458);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff458);
  DataStream::~DataStream((DataStream *)in_stack_fffffffffffff458);
  DataStream::~DataStream((DataStream *)in_stack_fffffffffffff458);
  PartiallySignedTransaction::~PartiallySignedTransaction
            ((PartiallySignedTransaction *)in_stack_fffffffffffff458);
  std::shared_ptr<const_CTransaction>::~shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_fffffffffffff458);
  DataStream::~DataStream((DataStream *)in_stack_fffffffffffff458);
  std::shared_ptr<const_CTransaction>::~shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_fffffffffffff458);
  DataStream::~DataStream((DataStream *)in_stack_fffffffffffff458);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffff458);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(psbt_updater_test)
{
    LOCK(m_wallet.cs_wallet);
    m_wallet.SetWalletFlag(WALLET_FLAG_DESCRIPTORS);

    // Create prevtxs and add to wallet
    DataStream s_prev_tx1{
        "0200000000010158e87a21b56daf0c23be8e7070456c336f7cbaa5c8757924f545887bb2abdd7501000000171600145f275f436b09a8cc9a2eb2a2f528485c68a56323feffffff02d8231f1b0100000017a914aed962d6654f9a2b36608eb9d64d2b260db4f1118700c2eb0b0000000017a914b7f5faf40e3d40a5a459b1db3535f2b72fa921e88702483045022100a22edcc6e5bc511af4cc4ae0de0fcd75c7e04d8c1c3a8aa9d820ed4b967384ec02200642963597b9b1bc22c75e9f3e117284a962188bf5e8a74c895089046a20ad770121035509a48eb623e10aace8bfd0212fdb8a8e5af3c94b0b133b95e114cab89e4f7965000000"_hex,
    };
    CTransactionRef prev_tx1;
    s_prev_tx1 >> TX_WITH_WITNESS(prev_tx1);
    m_wallet.mapWallet.emplace(std::piecewise_construct, std::forward_as_tuple(prev_tx1->GetHash()), std::forward_as_tuple(prev_tx1, TxStateInactive{}));

    DataStream s_prev_tx2{
        "0200000001aad73931018bd25f84ae400b68848be09db706eac2ac18298babee71ab656f8b0000000048473044022058f6fc7c6a33e1b31548d481c826c015bd30135aad42cd67790dab66d2ad243b02204a1ced2604c6735b6393e5b41691dd78b00f0c5942fb9f751856faa938157dba01feffffff0280f0fa020000000017a9140fb9463421696b82c833af241c78c17ddbde493487d0f20a270100000017a91429ca74f8a08f81999428185c97b5d852e4063f618765000000"_hex,
    };
    CTransactionRef prev_tx2;
    s_prev_tx2 >> TX_WITH_WITNESS(prev_tx2);
    m_wallet.mapWallet.emplace(std::piecewise_construct, std::forward_as_tuple(prev_tx2->GetHash()), std::forward_as_tuple(prev_tx2, TxStateInactive{}));

    // Import descriptors for keys and scripts
    import_descriptor(m_wallet, "sh(multi(2,xprv9s21ZrQH143K2LE7W4Xf3jATf9jECxSb7wj91ZnmY4qEJrS66Qru9RFqq8xbkgT32ya6HqYJweFdJUEDf5Q6JFV7jMiUws7kQfe6Tv4RbfN/0h/0h/0h,xprv9s21ZrQH143K2LE7W4Xf3jATf9jECxSb7wj91ZnmY4qEJrS66Qru9RFqq8xbkgT32ya6HqYJweFdJUEDf5Q6JFV7jMiUws7kQfe6Tv4RbfN/0h/0h/1h))");
    import_descriptor(m_wallet, "sh(wsh(multi(2,xprv9s21ZrQH143K2LE7W4Xf3jATf9jECxSb7wj91ZnmY4qEJrS66Qru9RFqq8xbkgT32ya6HqYJweFdJUEDf5Q6JFV7jMiUws7kQfe6Tv4RbfN/0h/0h/2h,xprv9s21ZrQH143K2LE7W4Xf3jATf9jECxSb7wj91ZnmY4qEJrS66Qru9RFqq8xbkgT32ya6HqYJweFdJUEDf5Q6JFV7jMiUws7kQfe6Tv4RbfN/0h/0h/3h)))");
    import_descriptor(m_wallet, "wpkh(xprv9s21ZrQH143K2LE7W4Xf3jATf9jECxSb7wj91ZnmY4qEJrS66Qru9RFqq8xbkgT32ya6HqYJweFdJUEDf5Q6JFV7jMiUws7kQfe6Tv4RbfN/0h/0h/*h)");

    // Call FillPSBT
    PartiallySignedTransaction psbtx;
    DataStream ssData{
        "70736274ff01009a020000000258e87a21b56daf0c23be8e7070456c336f7cbaa5c8757924f545887bb2abdd750000000000ffffffff838d0427d0ec650a68aa46bb0b098aea4422c071b2ca78352a077959d07cea1d0100000000ffffffff0270aaf00800000000160014d85c2b71d0060b09c9886aeb815e50991dda124d00e1f5050000000016001400aea9a2e5f0f876a588df5546e8742d1d87008f000000000000000000"_hex,
    };
    ssData >> psbtx;

    // Fill transaction with our data
    bool complete = true;
    BOOST_REQUIRE(!m_wallet.FillPSBT(psbtx, complete, SIGHASH_ALL, false, true));

    // Get the final tx
    DataStream ssTx{};
    ssTx << psbtx;
    std::string final_hex = HexStr(ssTx);
    BOOST_CHECK_EQUAL(final_hex, "70736274ff01009a020000000258e87a21b56daf0c23be8e7070456c336f7cbaa5c8757924f545887bb2abdd750000000000ffffffff838d0427d0ec650a68aa46bb0b098aea4422c071b2ca78352a077959d07cea1d0100000000ffffffff0270aaf00800000000160014d85c2b71d0060b09c9886aeb815e50991dda124d00e1f5050000000016001400aea9a2e5f0f876a588df5546e8742d1d87008f00000000000100bb0200000001aad73931018bd25f84ae400b68848be09db706eac2ac18298babee71ab656f8b0000000048473044022058f6fc7c6a33e1b31548d481c826c015bd30135aad42cd67790dab66d2ad243b02204a1ced2604c6735b6393e5b41691dd78b00f0c5942fb9f751856faa938157dba01feffffff0280f0fa020000000017a9140fb9463421696b82c833af241c78c17ddbde493487d0f20a270100000017a91429ca74f8a08f81999428185c97b5d852e4063f6187650000000104475221029583bf39ae0a609747ad199addd634fa6108559d6c5cd39b4c2183f1ab96e07f2102dab61ff49a14db6a7d02b0cd1fbb78fc4b18312b5b4e54dae4dba2fbfef536d752ae2206029583bf39ae0a609747ad199addd634fa6108559d6c5cd39b4c2183f1ab96e07f10d90c6a4f000000800000008000000080220602dab61ff49a14db6a7d02b0cd1fbb78fc4b18312b5b4e54dae4dba2fbfef536d710d90c6a4f0000008000000080010000800001008a020000000158e87a21b56daf0c23be8e7070456c336f7cbaa5c8757924f545887bb2abdd7501000000171600145f275f436b09a8cc9a2eb2a2f528485c68a56323feffffff02d8231f1b0100000017a914aed962d6654f9a2b36608eb9d64d2b260db4f1118700c2eb0b0000000017a914b7f5faf40e3d40a5a459b1db3535f2b72fa921e8876500000001012000c2eb0b0000000017a914b7f5faf40e3d40a5a459b1db3535f2b72fa921e88701042200208c2353173743b595dfb4a07b72ba8e42e3797da74e87fe7d9d7497e3b2028903010547522103089dc10c7ac6db54f91329af617333db388cead0c231f723379d1b99030b02dc21023add904f3d6dcf59ddb906b0dee23529b7ffb9ed50e5e86151926860221f0e7352ae2206023add904f3d6dcf59ddb906b0dee23529b7ffb9ed50e5e86151926860221f0e7310d90c6a4f000000800000008003000080220603089dc10c7ac6db54f91329af617333db388cead0c231f723379d1b99030b02dc10d90c6a4f00000080000000800200008000220203a9a4c37f5996d3aa25dbac6b570af0650394492942460b354753ed9eeca5877110d90c6a4f000000800000008004000080002202027f6399757d2eff55a136ad02c684b1838b6556e5f1b6b34282a94b6b5005109610d90c6a4f00000080000000800500008000");

    // Mutate the transaction so that one of the inputs is invalid
    psbtx.tx->vin[0].prevout.n = 2;

    // Try to sign the mutated input
    SignatureData sigdata;
    BOOST_CHECK(m_wallet.FillPSBT(psbtx, complete, SIGHASH_ALL, true, true));
}